

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  byte bVar23;
  long lVar24;
  ulong uVar25;
  byte bVar26;
  ulong uVar27;
  byte bVar28;
  NodeRef root;
  ulong *puVar29;
  undefined1 (*pauVar30) [32];
  bool bVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar63 [64];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5aa9;
  RayK<8> *local_5aa8;
  undefined4 local_5a9c;
  ulong local_5a98;
  RayQueryContext *local_5a90;
  size_t local_5a88;
  ulong local_5a80;
  BVH *local_5a78;
  Intersectors *local_5a70;
  RayK<8> *local_5a68;
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  undefined1 auVar58 [32];
  
  local_5a78 = (BVH *)This->ptr;
  local_5808 = (local_5a78->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar34 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar33 = ZEXT816(0) << 0x40;
      uVar32 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar33),5);
      uVar20 = vpcmpeqd_avx512vl(auVar34,(undefined1  [32])valid_i->field_0);
      uVar32 = uVar32 & uVar20;
      bVar26 = (byte)uVar32;
      if (bVar26 != 0) {
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar59 = ZEXT3264(auVar34);
        vandps_avx512vl(local_59e0,auVar34);
        auVar35._8_4_ = 0x219392ef;
        auVar35._0_8_ = 0x219392ef219392ef;
        auVar35._12_4_ = 0x219392ef;
        auVar35._16_4_ = 0x219392ef;
        auVar35._20_4_ = 0x219392ef;
        auVar35._24_4_ = 0x219392ef;
        auVar35._28_4_ = 0x219392ef;
        uVar20 = vcmpps_avx512vl(auVar34,auVar35,1);
        bVar31 = (bool)((byte)uVar20 & 1);
        auVar36._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._0_4_;
        bVar31 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._4_4_;
        bVar31 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._8_4_;
        bVar31 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._12_4_;
        bVar31 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._16_4_;
        bVar31 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._20_4_;
        bVar31 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._24_4_;
        bVar31 = SUB81(uVar20 >> 7,0);
        auVar36._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59e0._28_4_;
        vandps_avx512vl(local_59c0,auVar34);
        uVar20 = vcmpps_avx512vl(auVar36,auVar35,1);
        bVar31 = (bool)((byte)uVar20 & 1);
        auVar39._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._0_4_;
        bVar31 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._4_4_;
        bVar31 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._8_4_;
        bVar31 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._12_4_;
        bVar31 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar39._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._16_4_;
        bVar31 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar39._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._20_4_;
        bVar31 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar39._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._24_4_;
        bVar31 = SUB81(uVar20 >> 7,0);
        auVar39._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59c0._28_4_;
        vandps_avx512vl(local_59a0,auVar34);
        uVar20 = vcmpps_avx512vl(auVar39,auVar35,1);
        bVar31 = (bool)((byte)uVar20 & 1);
        auVar34._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._0_4_;
        bVar31 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._4_4_;
        bVar31 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._8_4_;
        bVar31 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._12_4_;
        bVar31 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._16_4_;
        bVar31 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._20_4_;
        bVar31 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._24_4_;
        bVar31 = SUB81(uVar20 >> 7,0);
        auVar34._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * local_59a0._28_4_;
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar37._16_4_ = 0x3f800000;
        auVar37._20_4_ = 0x3f800000;
        auVar37._24_4_ = 0x3f800000;
        auVar37._28_4_ = 0x3f800000;
        auVar35 = vrcp14ps_avx512vl(auVar36);
        auVar57 = vfnmadd213ps_fma(auVar36,auVar35,auVar37);
        auVar57 = vfmadd132ps_fma(ZEXT1632(auVar57),auVar35,auVar35);
        auVar36 = vrcp14ps_avx512vl(auVar39);
        auVar12 = vfnmadd213ps_fma(auVar39,auVar36,auVar37);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar36,auVar36);
        auVar36 = vrcp14ps_avx512vl(auVar34);
        auVar13 = vfnmadd213ps_fma(auVar34,auVar36,auVar37);
        local_5980 = ZEXT1632(auVar57);
        local_5960 = ZEXT1632(auVar12);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar36,auVar36);
        local_5940 = ZEXT1632(auVar13);
        local_5920 = (float)local_5a40._0_4_ * auVar57._0_4_;
        fStack_591c = (float)local_5a40._4_4_ * auVar57._4_4_;
        fStack_5918 = (float)local_5a40._8_4_ * auVar57._8_4_;
        fStack_5914 = (float)local_5a40._12_4_ * auVar57._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar12._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar12._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar12._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar12._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar13._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar13._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar13._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar13._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        uVar20 = vcmpps_avx512vl(ZEXT1632(auVar57),ZEXT1632(auVar33),1);
        auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_58c0 = (uint)((byte)uVar20 & 1) * auVar34._0_4_;
        iStack_58bc = (uint)((byte)(uVar20 >> 1) & 1) * auVar34._4_4_;
        iStack_58b8 = (uint)((byte)(uVar20 >> 2) & 1) * auVar34._8_4_;
        iStack_58b4 = (uint)((byte)(uVar20 >> 3) & 1) * auVar34._12_4_;
        iStack_58b0 = (uint)((byte)(uVar20 >> 4) & 1) * auVar34._16_4_;
        iStack_58ac = (uint)((byte)(uVar20 >> 5) & 1) * auVar34._20_4_;
        iStack_58a8 = (uint)((byte)(uVar20 >> 6) & 1) * auVar34._24_4_;
        iStack_58a4 = (uint)(byte)(uVar20 >> 7) * auVar34._28_4_;
        auVar36 = ZEXT1632(auVar33);
        uVar20 = vcmpps_avx512vl(ZEXT1632(auVar12),auVar36,5);
        auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar31 = (bool)((byte)uVar20 & 1);
        local_58a0 = (uint)bVar31 * auVar34._0_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 1) & 1);
        uStack_589c = (uint)bVar31 * auVar34._4_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 2) & 1);
        uStack_5898 = (uint)bVar31 * auVar34._8_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 3) & 1);
        uStack_5894 = (uint)bVar31 * auVar34._12_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 4) & 1);
        uStack_5890 = (uint)bVar31 * auVar34._16_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 5) & 1);
        uStack_588c = (uint)bVar31 * auVar34._20_4_ | (uint)!bVar31 * 0x60;
        bVar31 = (bool)((byte)(uVar20 >> 6) & 1);
        uStack_5888 = (uint)bVar31 * auVar34._24_4_ | (uint)!bVar31 * 0x60;
        bVar31 = SUB81(uVar20 >> 7,0);
        uStack_5884 = (uint)bVar31 * auVar34._28_4_ | (uint)!bVar31 * 0x60;
        uVar20 = vcmpps_avx512vl(ZEXT1632(auVar13),auVar36,5);
        auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar31 = (bool)((byte)uVar20 & 1);
        local_5880 = (uint)bVar31 * auVar34._0_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 1) & 1);
        uStack_587c = (uint)bVar31 * auVar34._4_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 2) & 1);
        uStack_5878 = (uint)bVar31 * auVar34._8_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 3) & 1);
        uStack_5874 = (uint)bVar31 * auVar34._12_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 4) & 1);
        uStack_5870 = (uint)bVar31 * auVar34._16_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 5) & 1);
        uStack_586c = (uint)bVar31 * auVar34._20_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = (bool)((byte)(uVar20 >> 6) & 1);
        uStack_5868 = (uint)bVar31 * auVar34._24_4_ | (uint)!bVar31 * 0xa0;
        bVar31 = SUB81(uVar20 >> 7,0);
        uStack_5864 = (uint)bVar31 * auVar34._28_4_ | (uint)!bVar31 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar61 = ZEXT3264(local_4680);
        auVar34 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar36);
        local_5860 = (uint)(bVar26 & 1) * auVar34._0_4_ |
                     (uint)!(bool)(bVar26 & 1) * local_4680._0_4_;
        bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
        uStack_585c = (uint)bVar31 * auVar34._4_4_ | (uint)!bVar31 * local_4680._4_4_;
        bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
        uStack_5858 = (uint)bVar31 * auVar34._8_4_ | (uint)!bVar31 * local_4680._8_4_;
        bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
        uStack_5854 = (uint)bVar31 * auVar34._12_4_ | (uint)!bVar31 * local_4680._12_4_;
        bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
        uStack_5850 = (uint)bVar31 * auVar34._16_4_ | (uint)!bVar31 * local_4680._16_4_;
        bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
        uStack_584c = (uint)bVar31 * auVar34._20_4_ | (uint)!bVar31 * local_4680._20_4_;
        bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
        uStack_5848 = (uint)bVar31 * auVar34._24_4_ | (uint)!bVar31 * local_4680._24_4_;
        bVar31 = SUB81(uVar32 >> 7,0);
        uStack_5844 = (uint)bVar31 * auVar34._28_4_ | (uint)!bVar31 * local_4680._28_4_;
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar60 = ZEXT3264(auVar34);
        local_5a9c = (undefined4)uVar32;
        auVar36 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar36);
        local_5840 = (uint)(bVar26 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar34._0_4_;
        bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
        uStack_583c = (uint)bVar31 * auVar36._4_4_ | (uint)!bVar31 * auVar34._4_4_;
        bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
        uStack_5838 = (uint)bVar31 * auVar36._8_4_ | (uint)!bVar31 * auVar34._8_4_;
        bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
        uStack_5834 = (uint)bVar31 * auVar36._12_4_ | (uint)!bVar31 * auVar34._12_4_;
        bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
        uStack_5830 = (uint)bVar31 * auVar36._16_4_ | (uint)!bVar31 * auVar34._16_4_;
        bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
        uStack_582c = (uint)bVar31 * auVar36._20_4_ | (uint)!bVar31 * auVar34._20_4_;
        bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
        uStack_5828 = (uint)bVar31 * auVar36._24_4_ | (uint)!bVar31 * auVar34._24_4_;
        bVar31 = SUB81(uVar32 >> 7,0);
        uStack_5824 = (uint)bVar31 * auVar36._28_4_ | (uint)!bVar31 * auVar34._28_4_;
        bVar26 = ~bVar26;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar32 = 7;
        }
        else {
          uVar32 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5a68 = ray + 0x100;
        puVar29 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar30 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        uStack_465c = uStack_585c;
        uStack_4658 = uStack_5858;
        uStack_4654 = uStack_5854;
        uStack_4650 = uStack_5850;
        uStack_464c = uStack_584c;
        uStack_4648 = uStack_5848;
        uStack_4644 = uStack_5844;
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar62 = ZEXT3264(auVar34);
        auVar33 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        auVar63 = ZEXT1664(auVar33);
        local_5a90 = context;
        local_5aa8 = ray;
        local_5a70 = This;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_007bec37:
        do {
          auVar34 = auVar60._0_32_;
          auVar38._4_4_ = uStack_583c;
          auVar38._0_4_ = local_5840;
          auVar38._8_4_ = uStack_5838;
          auVar38._12_4_ = uStack_5834;
          auVar38._16_4_ = uStack_5830;
          auVar38._20_4_ = uStack_582c;
          auVar38._24_4_ = uStack_5828;
          auVar38._28_4_ = uStack_5824;
          do {
            root.ptr = puVar29[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007bf1b3;
            puVar29 = puVar29 + -1;
            local_5a60 = pauVar30[-1];
            auVar53 = ZEXT3264(local_5a60);
            pauVar30 = pauVar30 + -1;
            local_5a80 = vcmpps_avx512vl(local_5a60,auVar38,1);
          } while ((char)local_5a80 == '\0');
          local_5a98 = (ulong)(uint)POPCOUNT((int)local_5a80);
          if (uVar32 < local_5a98) {
LAB_007bec7d:
            do {
              auVar34 = auVar60._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007bf1b3;
                auVar52._4_4_ = uStack_583c;
                auVar52._0_4_ = local_5840;
                auVar52._8_4_ = uStack_5838;
                auVar52._12_4_ = uStack_5834;
                auVar52._16_4_ = uStack_5830;
                auVar52._20_4_ = uStack_582c;
                auVar52._24_4_ = uStack_5828;
                auVar52._28_4_ = uStack_5824;
                uVar10 = vcmpps_avx512vl(auVar52,auVar53._0_32_,6);
                if ((char)uVar10 == '\0') goto LAB_007bec37;
                uVar20 = (ulong)((uint)root.ptr & 0xf);
                bVar21 = bVar26;
                if (uVar20 == 8) goto LAB_007bf08e;
                bVar21 = ~bVar26;
                auVar36 = *(undefined1 (*) [32])(ray + 0xa0);
                auVar39 = *(undefined1 (*) [32])(ray + 0xc0);
                auVar35 = *(undefined1 (*) [32])(ray + 0x80);
                lVar24 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                uVar22 = 0;
                goto LAB_007bee81;
              }
              lVar24 = 0;
              uVar20 = 8;
              auVar34 = auVar61._0_32_;
              do {
                uVar22 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar24 * 8);
                if (uVar22 == 8) {
                  auVar53 = ZEXT3264(auVar34);
                  break;
                }
                auVar51._4_4_ = fStack_591c;
                auVar51._0_4_ = local_5920;
                auVar51._8_4_ = fStack_5918;
                auVar51._12_4_ = fStack_5914;
                auVar51._16_4_ = fStack_5910;
                auVar51._20_4_ = fStack_590c;
                auVar51._24_4_ = fStack_5908;
                auVar51._28_4_ = uStack_5904;
                uVar1 = *(undefined4 *)(root.ptr + 0x40 + lVar24 * 4);
                auVar54._4_4_ = uVar1;
                auVar54._0_4_ = uVar1;
                auVar54._8_4_ = uVar1;
                auVar54._12_4_ = uVar1;
                auVar54._16_4_ = uVar1;
                auVar54._20_4_ = uVar1;
                auVar54._24_4_ = uVar1;
                auVar54._28_4_ = uVar1;
                auVar33 = vfmsub132ps_fma(auVar54,auVar51,local_5980);
                auVar14._4_4_ = fStack_58fc;
                auVar14._0_4_ = local_5900;
                auVar14._8_4_ = fStack_58f8;
                auVar14._12_4_ = fStack_58f4;
                auVar14._16_4_ = fStack_58f0;
                auVar14._20_4_ = fStack_58ec;
                auVar14._24_4_ = fStack_58e8;
                auVar14._28_4_ = uStack_58e4;
                uVar1 = *(undefined4 *)(root.ptr + 0x80 + lVar24 * 4);
                auVar55._4_4_ = uVar1;
                auVar55._0_4_ = uVar1;
                auVar55._8_4_ = uVar1;
                auVar55._12_4_ = uVar1;
                auVar55._16_4_ = uVar1;
                auVar55._20_4_ = uVar1;
                auVar55._24_4_ = uVar1;
                auVar55._28_4_ = uVar1;
                auVar15._4_4_ = fStack_58dc;
                auVar15._0_4_ = local_58e0;
                auVar15._8_4_ = fStack_58d8;
                auVar15._12_4_ = fStack_58d4;
                auVar15._16_4_ = fStack_58d0;
                auVar15._20_4_ = fStack_58cc;
                auVar15._24_4_ = fStack_58c8;
                auVar15._28_4_ = uStack_58c4;
                uVar1 = *(undefined4 *)(root.ptr + 0xc0 + lVar24 * 4);
                auVar56._4_4_ = uVar1;
                auVar56._0_4_ = uVar1;
                auVar56._8_4_ = uVar1;
                auVar56._12_4_ = uVar1;
                auVar56._16_4_ = uVar1;
                auVar56._20_4_ = uVar1;
                auVar56._24_4_ = uVar1;
                auVar56._28_4_ = uVar1;
                auVar57 = vfmsub132ps_fma(auVar55,auVar14,local_5960);
                auVar12 = vfmsub132ps_fma(auVar56,auVar15,local_5940);
                uVar1 = *(undefined4 *)(root.ptr + 0x60 + lVar24 * 4);
                auVar48._4_4_ = uVar1;
                auVar48._0_4_ = uVar1;
                auVar48._8_4_ = uVar1;
                auVar48._12_4_ = uVar1;
                auVar48._16_4_ = uVar1;
                auVar48._20_4_ = uVar1;
                auVar48._24_4_ = uVar1;
                auVar48._28_4_ = uVar1;
                auVar35 = vfmsub132ps_avx512vl(local_5980,auVar51,auVar48);
                uVar1 = *(undefined4 *)(root.ptr + 0xa0 + lVar24 * 4);
                auVar49._4_4_ = uVar1;
                auVar49._0_4_ = uVar1;
                auVar49._8_4_ = uVar1;
                auVar49._12_4_ = uVar1;
                auVar49._16_4_ = uVar1;
                auVar49._20_4_ = uVar1;
                auVar49._24_4_ = uVar1;
                auVar49._28_4_ = uVar1;
                auVar37 = vfmsub132ps_avx512vl(local_5960,auVar14,auVar49);
                uVar1 = *(undefined4 *)(root.ptr + 0xe0 + lVar24 * 4);
                auVar50._4_4_ = uVar1;
                auVar50._0_4_ = uVar1;
                auVar50._8_4_ = uVar1;
                auVar50._12_4_ = uVar1;
                auVar50._16_4_ = uVar1;
                auVar50._20_4_ = uVar1;
                auVar50._24_4_ = uVar1;
                auVar50._28_4_ = uVar1;
                auVar38 = vfmsub132ps_avx512vl(local_5940,auVar15,auVar50);
                auVar36 = vpminsd_avx2(ZEXT1632(auVar33),auVar35);
                auVar39 = vpminsd_avx2(ZEXT1632(auVar57),auVar37);
                auVar36 = vpmaxsd_avx2(auVar36,auVar39);
                auVar39 = vpminsd_avx2(ZEXT1632(auVar12),auVar38);
                auVar36 = vpmaxsd_avx2(auVar36,auVar39);
                auVar39 = vpmaxsd_avx2(ZEXT1632(auVar33),auVar35);
                auVar35 = vpmaxsd_avx2(ZEXT1632(auVar57),auVar37);
                auVar35 = vpminsd_avx2(auVar39,auVar35);
                auVar39 = vpmaxsd_avx2(ZEXT1632(auVar12),auVar38);
                auVar35 = vpminsd_avx2(auVar35,auVar39);
                auVar16._4_4_ = uStack_585c;
                auVar16._0_4_ = local_5860;
                auVar16._8_4_ = uStack_5858;
                auVar16._12_4_ = uStack_5854;
                auVar16._16_4_ = uStack_5850;
                auVar16._20_4_ = uStack_584c;
                auVar16._24_4_ = uStack_5848;
                auVar16._28_4_ = uStack_5844;
                auVar39 = vpmaxsd_avx2(auVar36,auVar16);
                auVar17._4_4_ = uStack_583c;
                auVar17._0_4_ = local_5840;
                auVar17._8_4_ = uStack_5838;
                auVar17._12_4_ = uStack_5834;
                auVar17._16_4_ = uStack_5830;
                auVar17._20_4_ = uStack_582c;
                auVar17._24_4_ = uStack_5828;
                auVar17._28_4_ = uStack_5824;
                auVar35 = vpminsd_avx2(auVar35,auVar17);
                uVar25 = vpcmpd_avx512vl(auVar39,auVar35,2);
                if ((byte)uVar25 == 0) {
                  auVar53 = ZEXT3264(auVar34);
                  uVar22 = uVar20;
                }
                else {
                  auVar39 = vblendmps_avx512vl(auVar61._0_32_,auVar36);
                  bVar31 = (bool)((byte)uVar25 & 1);
                  bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
                  bVar5 = (bool)((byte)(uVar25 >> 3) & 1);
                  bVar6 = (bool)((byte)(uVar25 >> 4) & 1);
                  bVar7 = (bool)((byte)(uVar25 >> 5) & 1);
                  bVar8 = (bool)((byte)(uVar25 >> 6) & 1);
                  bVar9 = SUB81(uVar25 >> 7,0);
                  auVar53 = ZEXT3264(CONCAT428((uint)bVar9 * auVar39._28_4_ |
                                               (uint)!bVar9 * auVar36._28_4_,
                                               CONCAT424((uint)bVar8 * auVar39._24_4_ |
                                                         (uint)!bVar8 * auVar36._24_4_,
                                                         CONCAT420((uint)bVar7 * auVar39._20_4_ |
                                                                   (uint)!bVar7 * auVar36._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             auVar39._16_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar36._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       auVar39.
                                                  _12_4_ | (uint)!bVar5 * auVar36._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar39._8_4_ |
                                                           (uint)!bVar4 * auVar36._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar39._4_4_ |
                                                                    (uint)!bVar3 * auVar36._4_4_,
                                                                    (uint)bVar31 * auVar39._0_4_ |
                                                                    (uint)!bVar31 * auVar36._0_4_)))
                                                  )))));
                  if (uVar20 != 8) {
                    *puVar29 = uVar20;
                    puVar29 = puVar29 + 1;
                    *pauVar30 = auVar34;
                    pauVar30 = pauVar30 + 1;
                  }
                }
                uVar20 = uVar22;
                lVar24 = lVar24 + 1;
                auVar34 = auVar53._0_32_;
              } while (lVar24 != 8);
              if (uVar20 == 8) goto LAB_007bede7;
              auVar18._4_4_ = uStack_583c;
              auVar18._0_4_ = local_5840;
              auVar18._8_4_ = uStack_5838;
              auVar18._12_4_ = uStack_5834;
              auVar18._16_4_ = uStack_5830;
              auVar18._20_4_ = uStack_582c;
              auVar18._24_4_ = uStack_5828;
              auVar18._28_4_ = uStack_5824;
              uVar10 = vcmpps_avx512vl(auVar53._0_32_,auVar18,9);
              root.ptr = uVar20;
            } while ((byte)uVar32 < (byte)POPCOUNT((int)uVar10));
            *puVar29 = uVar20;
            puVar29 = puVar29 + 1;
            *pauVar30 = auVar53._0_32_;
            pauVar30 = pauVar30 + 1;
LAB_007bede7:
            iVar19 = 4;
          }
          else {
            do {
              local_5a88 = 0;
              for (uVar20 = local_5a80; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                  ) {
                local_5a88 = local_5a88 + 1;
              }
              bVar31 = occluded1(local_5a70,local_5a78,root,local_5a88,&local_5aa9,local_5aa8,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5a90);
              bVar21 = (byte)(1 << ((uint)local_5a88 & 0x1f));
              if (!bVar31) {
                bVar21 = 0;
              }
              bVar26 = bVar26 | bVar21;
              local_5a80 = local_5a80 - 1 & local_5a80;
            } while (local_5a80 != 0);
            iVar19 = 3;
            if (bVar26 != 0xff) {
              auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5840 = (uint)(bVar26 & 1) * auVar34._0_4_ | !(bool)(bVar26 & 1) * local_5840;
              bVar31 = (bool)(bVar26 >> 1 & 1);
              uStack_583c = (uint)bVar31 * auVar34._4_4_ | !bVar31 * uStack_583c;
              bVar31 = (bool)(bVar26 >> 2 & 1);
              uStack_5838 = (uint)bVar31 * auVar34._8_4_ | !bVar31 * uStack_5838;
              bVar31 = (bool)(bVar26 >> 3 & 1);
              uStack_5834 = (uint)bVar31 * auVar34._12_4_ | !bVar31 * uStack_5834;
              bVar31 = (bool)(bVar26 >> 4 & 1);
              uStack_5830 = (uint)bVar31 * auVar34._16_4_ | !bVar31 * uStack_5830;
              bVar31 = (bool)(bVar26 >> 5 & 1);
              uStack_582c = (uint)bVar31 * auVar34._20_4_ | !bVar31 * uStack_582c;
              bVar31 = (bool)(bVar26 >> 6 & 1);
              uStack_5828 = (uint)bVar31 * auVar34._24_4_ | !bVar31 * uStack_5828;
              uStack_5824 = (uint)(bVar26 >> 7) * auVar34._28_4_ |
                            !(bool)(bVar26 >> 7) * uStack_5824;
              iVar19 = 2;
            }
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar59 = ZEXT3264(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar60 = ZEXT3264(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar61 = ZEXT3264(auVar34);
            auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar62 = ZEXT3264(auVar34);
            auVar33 = vxorps_avx512vl(auVar63._0_16_,auVar63._0_16_);
            auVar63 = ZEXT1664(auVar33);
            auVar53 = ZEXT3264(local_5a60);
            ray = local_5aa8;
            if ((uint)uVar32 < (uint)local_5a98) goto LAB_007bec7d;
          }
          auVar34 = auVar60._0_32_;
        } while (iVar19 != 3);
LAB_007bf1b3:
        bVar26 = bVar26 & (byte)local_5a9c;
        bVar31 = (bool)(bVar26 >> 1 & 1);
        bVar3 = (bool)(bVar26 >> 2 & 1);
        bVar4 = (bool)(bVar26 >> 3 & 1);
        bVar5 = (bool)(bVar26 >> 4 & 1);
        bVar6 = (bool)(bVar26 >> 5 & 1);
        bVar7 = (bool)(bVar26 >> 6 & 1);
        *(uint *)local_5a68 =
             (uint)(bVar26 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar26 & 1) * *(int *)local_5a68;
        *(uint *)(local_5a68 + 4) =
             (uint)bVar31 * auVar34._4_4_ | (uint)!bVar31 * *(int *)(local_5a68 + 4);
        *(uint *)(local_5a68 + 8) =
             (uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * *(int *)(local_5a68 + 8);
        *(uint *)(local_5a68 + 0xc) =
             (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * *(int *)(local_5a68 + 0xc);
        *(uint *)(local_5a68 + 0x10) =
             (uint)bVar5 * auVar34._16_4_ | (uint)!bVar5 * *(int *)(local_5a68 + 0x10);
        *(uint *)(local_5a68 + 0x14) =
             (uint)bVar6 * auVar34._20_4_ | (uint)!bVar6 * *(int *)(local_5a68 + 0x14);
        *(uint *)(local_5a68 + 0x18) =
             (uint)bVar7 * auVar34._24_4_ | (uint)!bVar7 * *(int *)(local_5a68 + 0x18);
        *(uint *)(local_5a68 + 0x1c) =
             (uint)(bVar26 >> 7) * auVar34._28_4_ |
             (uint)!(bool)(bVar26 >> 7) * *(int *)(local_5a68 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar22 = uVar22 + 1;
    lVar24 = lVar24 + 0xb0;
    if (uVar20 - 8 <= uVar22) break;
LAB_007bee81:
    uVar25 = 0;
    bVar23 = bVar21;
    while (uVar27 = (ulong)*(uint *)(lVar24 + uVar25 * 4), uVar27 != 0xffffffff) {
      uVar1 = *(undefined4 *)(lVar24 + -0x90 + uVar25 * 4);
      auVar40._4_4_ = uVar1;
      auVar40._0_4_ = uVar1;
      auVar40._8_4_ = uVar1;
      auVar40._12_4_ = uVar1;
      auVar40._16_4_ = uVar1;
      auVar40._20_4_ = uVar1;
      auVar40._24_4_ = uVar1;
      auVar40._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar24 + -0x80 + uVar25 * 4);
      auVar41._4_4_ = uVar1;
      auVar41._0_4_ = uVar1;
      auVar41._8_4_ = uVar1;
      auVar41._12_4_ = uVar1;
      auVar41._16_4_ = uVar1;
      auVar41._20_4_ = uVar1;
      auVar41._24_4_ = uVar1;
      auVar41._28_4_ = uVar1;
      auVar37 = vsubps_avx(auVar40,*(undefined1 (*) [32])ray);
      auVar38 = vsubps_avx(auVar41,*(undefined1 (*) [32])(ray + 0x20));
      uVar1 = *(undefined4 *)(lVar24 + -0x70 + uVar25 * 4);
      auVar43._4_4_ = uVar1;
      auVar43._0_4_ = uVar1;
      auVar43._8_4_ = uVar1;
      auVar43._12_4_ = uVar1;
      auVar43._16_4_ = uVar1;
      auVar43._20_4_ = uVar1;
      auVar43._24_4_ = uVar1;
      auVar43._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar24 + -0x60 + uVar25 * 4);
      auVar57._4_4_ = uVar1;
      auVar57._0_4_ = uVar1;
      auVar57._8_4_ = uVar1;
      auVar57._12_4_ = uVar1;
      auVar58._16_4_ = uVar1;
      auVar58._0_16_ = auVar57;
      auVar58._20_4_ = uVar1;
      auVar58._24_4_ = uVar1;
      auVar58._28_4_ = uVar1;
      auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x50 + uVar25 * 4)));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x40 + uVar25 * 4)));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x30 + uVar25 * 4)));
      auVar52 = vsubps_avx(auVar43,*(undefined1 (*) [32])(ray + 0x40));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x20 + uVar25 * 4)));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar24 + -0x10 + uVar25 * 4)));
      auVar33 = vmulss_avx512f(auVar40._0_16_,auVar44._0_16_);
      auVar45._0_4_ = auVar33._0_4_;
      auVar45._4_4_ = auVar45._0_4_;
      auVar45._8_4_ = auVar45._0_4_;
      auVar45._12_4_ = auVar45._0_4_;
      auVar45._16_4_ = auVar45._0_4_;
      auVar45._20_4_ = auVar45._0_4_;
      auVar45._24_4_ = auVar45._0_4_;
      auVar45._28_4_ = auVar45._0_4_;
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar41);
      auVar33 = vmulss_avx512f(auVar41._0_16_,auVar42._0_16_);
      auVar46._0_4_ = auVar33._0_4_;
      auVar46._4_4_ = auVar46._0_4_;
      auVar46._8_4_ = auVar46._0_4_;
      auVar46._12_4_ = auVar46._0_4_;
      auVar46._16_4_ = auVar46._0_4_;
      auVar46._20_4_ = auVar46._0_4_;
      auVar46._24_4_ = auVar46._0_4_;
      auVar46._28_4_ = auVar46._0_4_;
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar44,auVar58);
      auVar33 = vmulss_avx512f(auVar57,auVar43._0_16_);
      auVar47 = vbroadcastss_avx512vl(auVar33);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar42,auVar40);
      auVar48 = vmulps_avx512vl(auVar36,auVar52);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar38,auVar39);
      auVar49 = vmulps_avx512vl(auVar39,auVar37);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar52,auVar35);
      auVar50 = vmulps_avx512vl(auVar35,auVar38);
      auVar50 = vfmsub231ps_avx512vl(auVar50,auVar37,auVar36);
      auVar51 = vmulps_avx512vl(auVar47,auVar39);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar46,auVar36);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar45,auVar35);
      vandps_avx512vl(auVar51,auVar62._0_32_);
      auVar44 = vmulps_avx512vl(auVar44,auVar50);
      auVar43 = vfmadd231ps_avx512vl(auVar44,auVar49,auVar43);
      auVar42 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar42);
      auVar42 = vxorps_avx512vl(auVar51,auVar42);
      uVar10 = vcmpps_avx512vl(auVar42,auVar63._0_32_,5);
      bVar28 = (byte)uVar10 & bVar23;
      if (bVar28 == 0) {
LAB_007bef84:
        bVar28 = 0;
      }
      else {
        auVar41 = vmulps_avx512vl(auVar41,auVar50);
        auVar40 = vfmadd213ps_avx512vl(auVar49,auVar40,auVar41);
        auVar40 = vfmadd213ps_avx512vl(auVar48,auVar58,auVar40);
        auVar40 = vxorps_avx512vl(auVar51,auVar40);
        uVar10 = vcmpps_avx512vl(auVar40,auVar63._0_32_,5);
        bVar28 = bVar28 & (byte)uVar10;
        if (bVar28 == 0) goto LAB_007bef84;
        vandps_avx512vl(auVar51,auVar59._0_32_);
        auVar41 = vsubps_avx512vl(auVar40,auVar42);
        uVar10 = vcmpps_avx512vl(auVar41,auVar40,5);
        bVar28 = bVar28 & (byte)uVar10;
        if (bVar28 == 0) goto LAB_007bef84;
        auVar52 = vmulps_avx512vl(auVar47,auVar52);
        auVar33 = vfmadd213ps_fma(auVar38,auVar46,auVar52);
        auVar33 = vfmadd213ps_fma(auVar37,auVar45,ZEXT1632(auVar33));
        auVar37 = vxorps_avx512vl(auVar51,ZEXT1632(auVar33));
        auVar44._0_4_ = auVar40._0_4_ * *(float *)(ray + 0x60);
        auVar44._4_4_ = auVar40._4_4_ * *(float *)(ray + 100);
        auVar44._8_4_ = auVar40._8_4_ * *(float *)(ray + 0x68);
        auVar44._12_4_ = auVar40._12_4_ * *(float *)(ray + 0x6c);
        auVar44._16_4_ = auVar40._16_4_ * *(float *)(ray + 0x70);
        auVar44._20_4_ = auVar40._20_4_ * *(float *)(ray + 0x74);
        auVar44._24_4_ = auVar40._24_4_ * *(float *)(ray + 0x78);
        auVar44._28_4_ = 0;
        auVar42._4_4_ = auVar40._4_4_ * *(float *)(ray + 0x104);
        auVar42._0_4_ = auVar40._0_4_ * *(float *)(ray + 0x100);
        auVar42._8_4_ = auVar40._8_4_ * *(float *)(ray + 0x108);
        auVar42._12_4_ = auVar40._12_4_ * *(float *)(ray + 0x10c);
        auVar42._16_4_ = auVar40._16_4_ * *(float *)(ray + 0x110);
        auVar42._20_4_ = auVar40._20_4_ * *(float *)(ray + 0x114);
        auVar42._24_4_ = auVar40._24_4_ * *(float *)(ray + 0x118);
        auVar42._28_4_ = auVar52._28_4_;
        uVar10 = vcmpps_avx512vl(auVar37,auVar42,2);
        uVar11 = vcmpps_avx512vl(auVar44,auVar37,1);
        bVar28 = bVar28 & (byte)uVar10 & (byte)uVar11;
        auVar33 = auVar63._0_16_;
        if (bVar28 == 0) {
          bVar28 = 0;
          auVar33 = vxorps_avx512vl(auVar33,auVar33);
          auVar63 = ZEXT1664(auVar33);
        }
        else {
          auVar33 = vxorps_avx512vl(auVar33,auVar33);
          auVar63 = ZEXT1664(auVar33);
          uVar10 = vcmpps_avx512vl(auVar51,ZEXT1632(auVar33),4);
          bVar28 = bVar28 & (byte)uVar10;
        }
      }
      uVar2 = ((local_5a90->scene->geometries).items[uVar27].ptr)->mask;
      auVar47._4_4_ = uVar2;
      auVar47._0_4_ = uVar2;
      auVar47._8_4_ = uVar2;
      auVar47._12_4_ = uVar2;
      auVar47._16_4_ = uVar2;
      auVar47._20_4_ = uVar2;
      auVar47._24_4_ = uVar2;
      auVar47._28_4_ = uVar2;
      uVar10 = vptestmd_avx512vl(*(undefined1 (*) [32])(ray + 0x120),auVar47);
      bVar23 = bVar23 & ~((byte)uVar10 & bVar28);
      if ((bVar23 == 0) || (bVar31 = 2 < uVar25, uVar25 = uVar25 + 1, bVar31)) break;
    }
    bVar21 = bVar21 & bVar23;
    if (bVar21 == 0) break;
  }
  bVar21 = ~bVar21;
  ray = local_5aa8;
LAB_007bf08e:
  bVar26 = bVar26 | bVar21;
  if (bVar26 == 0xff) {
    bVar26 = 0xff;
    goto LAB_007bf1b3;
  }
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5840 = (uint)(bVar26 & 1) * auVar34._0_4_ | !(bool)(bVar26 & 1) * local_5840;
  bVar31 = (bool)(bVar26 >> 1 & 1);
  uStack_583c = (uint)bVar31 * auVar34._4_4_ | !bVar31 * uStack_583c;
  bVar31 = (bool)(bVar26 >> 2 & 1);
  uStack_5838 = (uint)bVar31 * auVar34._8_4_ | !bVar31 * uStack_5838;
  bVar31 = (bool)(bVar26 >> 3 & 1);
  uStack_5834 = (uint)bVar31 * auVar34._12_4_ | !bVar31 * uStack_5834;
  bVar31 = (bool)(bVar26 >> 4 & 1);
  uStack_5830 = (uint)bVar31 * auVar34._16_4_ | !bVar31 * uStack_5830;
  bVar31 = (bool)(bVar26 >> 5 & 1);
  uStack_582c = (uint)bVar31 * auVar34._20_4_ | !bVar31 * uStack_582c;
  bVar31 = (bool)(bVar26 >> 6 & 1);
  uStack_5828 = (uint)bVar31 * auVar34._24_4_ | !bVar31 * uStack_5828;
  uStack_5824 = (uint)(bVar26 >> 7) * auVar34._28_4_ | !(bool)(bVar26 >> 7) * uStack_5824;
  goto LAB_007bec37;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }